

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
pstack::Elf::Object::symbolVersion_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Object *this,VersionIdx idx)

{
  mapped_type *__t;
  uint local_2c;
  SymbolVersioning *pSStack_28;
  uint i;
  SymbolVersioning *vi;
  Object *this_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poStack_10;
  VersionIdx idx_local;
  
  vi = (SymbolVersioning *)this;
  this_local._6_2_ = idx.idx;
  poStack_10 = __return_storage_ptr__;
  pSStack_28 = symbolVersions(this);
  local_2c = this_local._6_2_ & 0x7fff;
  if (local_2c < 2) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    __t = std::
          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::at(&pSStack_28->versions,&local_2c);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (__return_storage_ptr__,__t);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Object::symbolVersion(VersionIdx idx) const {
    const SymbolVersioning *vi = symbolVersions();

    unsigned i = idx.idx & 0x7fffU;
    if (i >= 2)
        return vi->versions.at(i);
    else
        return std::nullopt;
}